

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3fa.h
# Opt level: O2

BBox<embree::Vec3fa> *
embree::BBox<embree::Vec3fa>::merge(BBox<embree::Vec3fa> *a,BBox<embree::Vec3fa> *b)

{
  BBox<embree::Vec3fa> *in_RDI;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  
  aVar1.m128 = (__m128)minps((a->lower).field_0,(b->lower).field_0);
  aVar2.m128 = (__m128)maxps((a->upper).field_0,(b->upper).field_0);
  (in_RDI->lower).field_0 = aVar1;
  (in_RDI->upper).field_0 = aVar2;
  return in_RDI;
}

Assistant:

__forceinline Vec3fa max( const Vec3fa& a, const Vec3fa& b ) { return _mm_max_ps(a.m128,b.m128); }